

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

void __thiscall Saturation::SaturationAlgorithm::addNewClause(SaturationAlgorithm *this,Clause *cl)

{
  if (*(char *)(Lib::env + 0x16b2) == '\x01') {
    Shell::Shuffling::shuffle(cl);
  }
  cl->_refCnt = cl->_refCnt + 1;
  onNewClause(this,cl);
  Kernel::RCClauseStack::push(&this->_newClauses,cl);
  Kernel::Clause::decRefCnt(cl);
  return;
}

Assistant:

void SaturationAlgorithm::addNewClause(Clause* cl)
{
  if (env.options->randomTraversals()) {
    TIME_TRACE(TimeTrace::SHUFFLING);

    Shuffling::shuffle(cl);
  }

  // we increase the reference counter here so that the clause wouldn't
  // get destroyed during handling in the onNewClause handler
  //(there the control flow goes out of the SaturationAlgorithm class,
  // so we'd better not assume on what's happening out there)
  cl->incRefCnt();
  onNewClause(cl);
  _newClauses.push(cl);
  // we can decrease the counter here -- it won't get deleted because
  // the _newClauses RC stack already took over the clause
  cl->decRefCnt();
}